

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

cmCPackIFWPackage * __thiscall
cmCPackIFWGenerator::GetComponentPackage(cmCPackIFWGenerator *this,cmCPackComponent *component)

{
  const_iterator cVar1;
  cmCPackIFWPackage *pcVar2;
  cmCPackComponent *local_10;
  
  local_10 = component;
  cVar1 = std::
          _Rb_tree<cmCPackComponent_*,_std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>,_std::_Select1st<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
          ::find(&(this->ComponentPackages)._M_t,&local_10);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->ComponentPackages)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = (cmCPackIFWPackage *)0x0;
  }
  else {
    pcVar2 = (cmCPackIFWPackage *)cVar1._M_node[1]._M_parent;
  }
  return pcVar2;
}

Assistant:

cmCPackIFWPackage* cmCPackIFWGenerator::GetComponentPackage(
  cmCPackComponent* component) const
{
  auto pit = this->ComponentPackages.find(component);
  return pit != this->ComponentPackages.end() ? pit->second : nullptr;
}